

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  TokenType TVar1;
  bool bVar2;
  long *plVar3;
  _Elt_pointer ppVVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  byte unaff_R12B;
  byte bVar6;
  char cVar7;
  Value numberName;
  String name;
  Token colon;
  Token comma;
  Token tokenName;
  Value init;
  ValueHolder local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  String local_c8;
  String local_a8;
  Token local_88;
  Token local_70;
  Value local_58;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar4 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar4[-1],&local_58);
  ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar4 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar4[-1],(long)token->start_ - (long)this->begin_);
  do {
    bVar2 = readToken(this,&local_70);
    if (!bVar2) goto LAB_0060c74e;
    bVar2 = true;
    while ((TVar1 = local_70.type_, bVar2 != false && (local_70.type_ == tokenComment))) {
      bVar2 = readToken(this,&local_70);
    }
    if (bVar2 == false) goto LAB_0060c460;
    if (local_70.type_ == tokenObjectEnd) {
      cVar7 = '\x01';
      bVar6 = 1;
      if ((local_c8._M_string_length != 0) && ((this->features_).allowTrailingCommas_ == false))
      goto LAB_0060c3b5;
    }
    else {
LAB_0060c3b5:
      local_c8._M_string_length = 0;
      *local_c8._M_dataplus._M_p = '\0';
      if (TVar1 == tokenNumber) {
        if ((this->features_).allowNumericKeys_ != true) goto LAB_0060c460;
        Value::Value((Value *)&local_f0,nullValue);
        bVar2 = decodeNumber(this,&local_70,(Value *)&local_f0);
        if (bVar2) {
          Value::asString_abi_cxx11_(&local_a8,(Value *)&local_f0);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
              &local_a8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p)
                            ,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
          unaff_R12B = 0;
        }
        Value::~Value((Value *)&local_f0);
        cVar7 = '\x01';
        bVar6 = unaff_R12B;
        if (bVar2) goto LAB_0060c49a;
      }
      else if (TVar1 == tokenString) {
        bVar2 = decodeString(this,&local_70,&local_c8);
        if (bVar2) {
LAB_0060c49a:
          if (0x3fffffff < local_c8._M_string_length) {
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"keylength >= 2^30","");
            throwRuntimeError((String *)&local_f0);
          }
          if ((this->features_).rejectDupKeys_ == true) {
            ppVVar4 = (this->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (ppVVar4 ==
                (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVVar4 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            bVar2 = Value::isMember(ppVVar4[-1],&local_c8);
            if (!bVar2) goto LAB_0060c53e;
            std::operator+(&local_a8,"Duplicate key: \'",&local_c8);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
            local_f0.string_ = (char *)&local_e0;
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 == paVar5) {
              local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_e0._8_8_ = plVar3[3];
            }
            else {
              local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_f0.string_ = ((char *)*plVar3).string_;
            }
            local_e8 = plVar3[1];
            *plVar3 = (long)paVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
                &local_a8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                       (int)local_a8._M_dataplus._M_p),
                              local_a8.field_2._M_allocated_capacity + 1);
            }
            addError(this,(String *)&local_f0,&local_70,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          else {
LAB_0060c53e:
            bVar2 = readToken(this,(Token *)&local_a8);
            if (bVar2 && (int)local_a8._M_dataplus._M_p == 0xe) {
              ppVVar4 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar4 ==
                  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVVar4 = (this->nodes_).c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              local_f0.map_ = (ObjectValues *)Value::operator[](ppVVar4[-1],&local_c8);
              std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
                        ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                         (Value **)&local_f0.map_);
              bVar2 = readValue(this);
              std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                        ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
              if (bVar2) {
                bVar2 = readToken(this,&local_88);
                if (((bVar2) && (local_88.type_ < tokenError)) &&
                   ((0xa004U >> (local_88.type_ & (tokenError|tokenComment)) & 1) != 0)) {
                  bVar2 = true;
                  while ((bVar2 != false && (local_88.type_ == tokenComment))) {
                    bVar2 = readToken(this,&local_88);
                  }
                  cVar7 = local_88.type_ == tokenObjectEnd;
                  bVar6 = unaff_R12B | cVar7;
                }
                else {
                  local_f0.string_ = (char *)&local_e0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
                  addError(this,(String *)&local_f0,&local_88,(Location)0x0);
                  recoverFromError(this,tokenObjectEnd);
                  if (local_f0 != &local_e0) {
                    operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
                  }
                  cVar7 = '\x01';
                  bVar6 = 0;
                }
                goto LAB_0060c468;
              }
              recoverFromError(this,tokenObjectEnd);
              goto LAB_0060c72c;
            }
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Missing \':\' after object member name","");
            addError(this,(String *)&local_f0,(Token *)&local_a8,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
LAB_0060c72c:
        cVar7 = '\x01';
        bVar6 = 0;
      }
      else {
LAB_0060c460:
        cVar7 = '\x03';
        bVar6 = unaff_R12B;
      }
    }
LAB_0060c468:
    unaff_R12B = bVar6;
  } while (cVar7 == '\0');
  if (cVar7 == '\x03') {
LAB_0060c74e:
    local_f0.string_ = (char *)&local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Missing \'}\' or object member name","");
    addError(this,(String *)&local_f0,&local_70,(Location)0x0);
    recoverFromError(this,tokenObjectEnd);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
    }
    bVar6 = 0;
  }
  Value::~Value(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}